

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  int iVar1;
  ImVector<ImGuiStyleMod> *this;
  ImGuiStyleMod local_34;
  float *local_28;
  float *pvar;
  ImGuiContext *g;
  ImGuiStyleVarInfo *var_info;
  float val_local;
  ImGuiStyleVar idx_local;
  
  var_info._0_4_ = val;
  var_info._4_4_ = idx;
  g = (ImGuiContext *)GetStyleVarInfo(idx);
  iVar1._0_1_ = g->Initialized;
  iVar1._1_1_ = g->FontAtlasOwnedByContext;
  iVar1._2_2_ = *(undefined2 *)&g->field_0x2;
  if ((iVar1 == 8) && (*(ImU32 *)&g->field_0x4 == 1)) {
    pvar = (float *)GImGui;
    local_28 = (float *)ImGuiStyleVarInfo::GetVarPtr((ImGuiStyleVarInfo *)g,&GImGui->Style);
    this = (ImVector<ImGuiStyleMod> *)(pvar + 0x752);
    ImGuiStyleMod::ImGuiStyleMod(&local_34,var_info._4_4_,*local_28);
    ImVector<ImGuiStyleMod>::push_back(this,&local_34);
    *local_28 = var_info._0_4_;
    return;
  }
  __assert_fail("0 && \"Called PushStyleVar() float variant but variable is not a float!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x9fb,"void ImGui::PushStyleVar(ImGuiStyleVar, float)");
}

Assistant:

void ImGui::PushStyleVar(ImGuiStyleVar idx, float val)
{
    const ImGuiStyleVarInfo* var_info = GetStyleVarInfo(idx);
    if (var_info->Type == ImGuiDataType_Float && var_info->Count == 1)
    {
        ImGuiContext& g = *GImGui;
        float* pvar = (float*)var_info->GetVarPtr(&g.Style);
        g.StyleVarStack.push_back(ImGuiStyleMod(idx, *pvar));
        *pvar = val;
        return;
    }
    IM_ASSERT(0 && "Called PushStyleVar() float variant but variable is not a float!");
}